

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcNdr.c
# Opt level: O3

void Wlc_NtkToNdrTest(Wlc_Ntk_t *pNtk)

{
  byte bVar1;
  bool bVar2;
  Ndr_Data_t *p_00;
  void *__ptr;
  char *pcVar3;
  uchar *puVar4;
  uint *puVar5;
  uint *puVar6;
  FILE *pFVar7;
  int Obj;
  int iVar8;
  byte bVar9;
  uint uVar10;
  int iVar11;
  undefined8 uVar12;
  int Ent_1;
  int iVar13;
  uint uVar14;
  int Ent;
  int iVar15;
  size_t __size;
  char *__format;
  int iVar16;
  uint *puVar17;
  undefined8 uVar18;
  uint uVar19;
  int Ent_2;
  int iVar20;
  long lVar21;
  ulong uVar22;
  Ndr_Data_t *p;
  ulong local_68;
  void *local_50;
  
  p_00 = (Ndr_Data_t *)Wlc_NtkToNdr(pNtk);
  iVar11 = pNtk->iObj;
  __ptr = malloc((long)iVar11 * 8);
  if (1 < (long)iVar11) {
    lVar21 = 1;
    do {
      if (pNtk->nObjsAlloc <= lVar21) {
        __assert_fail("Id > 0 && Id < p->nObjsAlloc",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlc.h"
                      ,0x11a,"Wlc_Obj_t *Wlc_NtkObj(Wlc_Ntk_t *, int)");
      }
      pcVar3 = Wlc_ObjName(pNtk,(int)lVar21);
      *(char **)((long)__ptr + lVar21 * 8) = pcVar3;
      lVar21 = lVar21 + 1;
    } while (lVar21 < pNtk->iObj);
  }
  pFVar7 = _stdout;
  if (_stdout == (FILE *)0x0) {
    printf("Cannot open file \"%s\" for writing.\n",0);
  }
  else {
    puVar6 = p_00->pBody;
    if (1 < (int)*puVar6) {
      puVar4 = p_00->pHead;
      iVar11 = 1;
      do {
        bVar9 = puVar4[iVar11];
        if (bVar9 == 2) {
          Obj = iVar11 + 1;
          iVar13 = puVar6[iVar11] + iVar11;
          if (Obj < iVar13) {
            iVar20 = 0;
            iVar8 = Obj;
            do {
              bVar9 = puVar4[iVar8];
              if (bVar9 == 3) {
                for (iVar15 = iVar8 + 1; iVar15 < (int)(puVar6[iVar8] + iVar8);
                    iVar15 = iVar15 + uVar10) {
                  bVar1 = puVar4[iVar15];
                  if (bVar1 == 6) {
                    iVar20 = iVar20 + (uint)(puVar6[iVar15] == 4);
                    goto LAB_00364610;
                  }
                  if (bVar1 == 0) goto LAB_0036609d;
                  uVar10 = 1;
                  if (bVar1 < 4) {
                    uVar10 = puVar6[iVar15];
                  }
                }
                iVar20 = iVar20 + 1;
              }
              else if (bVar9 == 0) goto LAB_0036609d;
LAB_00364610:
              uVar10 = 1;
              if (bVar9 < 4) {
                uVar10 = puVar6[iVar8];
              }
              iVar8 = iVar8 + uVar10;
            } while (iVar8 < iVar13);
            local_50 = malloc((long)iVar20 << 2);
            iVar8 = Obj;
            do {
              bVar9 = puVar4[iVar8];
              if (bVar9 == 7) {
                lVar21 = (long)(int)puVar6[iVar8];
                goto LAB_00364682;
              }
              if (bVar9 == 0) goto LAB_0036609d;
              uVar10 = 1;
              if (bVar9 < 4) {
                uVar10 = puVar6[iVar8];
              }
              iVar8 = iVar8 + uVar10;
            } while (iVar8 < iVar13);
          }
          else {
            local_50 = malloc(0);
          }
          lVar21 = -1;
LAB_00364682:
          fprintf(pFVar7,"\nmodule %s (\n  ",*(undefined8 *)((long)__ptr + lVar21 * 8));
          puVar6 = p_00->pBody;
          if (Obj < (int)(puVar6[iVar11] + iVar11)) {
            puVar4 = p_00->pHead;
            iVar13 = Obj;
            do {
              bVar9 = puVar4[iVar13];
              if (bVar9 == 3) {
                iVar20 = iVar13 + 1;
                uVar10 = puVar6[iVar13];
                iVar15 = uVar10 + iVar13;
                lVar21 = -1;
                iVar8 = iVar20;
                if (iVar20 < iVar15) {
                  do {
                    bVar9 = puVar4[iVar8];
                    if (bVar9 == 6) {
                      if (puVar6[iVar8] != 3) goto LAB_00364795;
                      break;
                    }
                    if (bVar9 == 0) goto LAB_0036609d;
                    uVar14 = 1;
                    if (bVar9 < 4) {
                      uVar14 = puVar6[iVar8];
                    }
                    iVar8 = iVar8 + uVar14;
                  } while (iVar8 < iVar15);
                  do {
                    bVar9 = puVar4[iVar20];
                    if (bVar9 == 5) {
                      lVar21 = (long)(int)puVar6[iVar20];
                      break;
                    }
                    if (bVar9 == 0) goto LAB_0036609d;
                    uVar10 = 1;
                    if (bVar9 < 4) {
                      uVar10 = puVar6[iVar20];
                    }
                    iVar20 = iVar20 + uVar10;
                  } while (iVar20 < iVar15);
                }
                fprintf(pFVar7,"%s, ",*(undefined8 *)((long)__ptr + lVar21 * 8));
                puVar4 = p_00->pHead;
                bVar9 = puVar4[iVar13];
              }
              else if (bVar9 == 0) goto LAB_0036609d;
              if (bVar9 == 0) goto LAB_0036609d;
              puVar6 = p_00->pBody;
              uVar10 = 1;
              if (bVar9 < 4) {
                uVar10 = puVar6[iVar13];
              }
LAB_00364795:
              iVar13 = iVar13 + uVar10;
            } while (iVar13 < (int)(puVar6[iVar11] + iVar11));
          }
          fwrite("\n  ",3,1,pFVar7);
          puVar6 = p_00->pBody;
          if (Obj < (int)(puVar6[iVar11] + iVar11)) {
            puVar4 = p_00->pHead;
            bVar2 = true;
            iVar13 = Obj;
            do {
              bVar9 = puVar4[iVar13];
              if (bVar9 == 3) {
                iVar20 = iVar13 + 1;
                uVar10 = puVar6[iVar13];
                iVar15 = uVar10 + iVar13;
                iVar8 = iVar20;
                if (iVar20 < iVar15) {
                  do {
                    bVar9 = puVar4[iVar8];
                    if (bVar9 == 6) {
                      if (puVar6[iVar8] != 4) goto LAB_003648ef;
                      break;
                    }
                    if (bVar9 == 0) goto LAB_0036609d;
                    uVar14 = 1;
                    if (bVar9 < 4) {
                      uVar14 = puVar6[iVar8];
                    }
                    iVar8 = iVar8 + uVar14;
                  } while (iVar8 < iVar15);
                  pcVar3 = "";
                  if (!bVar2) {
                    pcVar3 = ", ";
                  }
                  do {
                    bVar9 = puVar4[iVar20];
                    if (bVar9 == 4) {
                      lVar21 = (long)(int)puVar6[iVar20];
                      goto LAB_003648af;
                    }
                    if (bVar9 == 0) goto LAB_0036609d;
                    uVar10 = 1;
                    if (bVar9 < 4) {
                      uVar10 = puVar6[iVar20];
                    }
                    iVar20 = iVar20 + uVar10;
                  } while (iVar20 < iVar15);
                }
                else {
                  pcVar3 = "";
                  if (!bVar2) {
                    pcVar3 = ", ";
                  }
                }
                lVar21 = -1;
LAB_003648af:
                bVar2 = false;
                fprintf(pFVar7,"%s%s",pcVar3,*(undefined8 *)((long)__ptr + lVar21 * 8));
                puVar4 = p_00->pHead;
                bVar9 = puVar4[iVar13];
              }
              else if (bVar9 == 0) goto LAB_0036609d;
              if (bVar9 == 0) goto LAB_0036609d;
              puVar6 = p_00->pBody;
              uVar10 = 1;
              if (bVar9 < 4) {
                uVar10 = puVar6[iVar13];
              }
LAB_003648ef:
              iVar13 = iVar13 + uVar10;
            } while (iVar13 < (int)(puVar6[iVar11] + iVar11));
          }
          fwrite("\n);\n\n",5,1,pFVar7);
          puVar6 = p_00->pBody;
          iVar13 = puVar6[iVar11] + iVar11;
          if (Obj < iVar13) {
            puVar4 = p_00->pHead;
            iVar8 = Obj;
            do {
              bVar9 = puVar4[iVar8];
              if (bVar9 == 3) {
                uVar10 = puVar6[iVar8];
                iVar20 = iVar8 + 1;
                for (iVar13 = iVar20; iVar13 < (int)(uVar10 + iVar8); iVar13 = iVar13 + uVar14) {
                  bVar9 = puVar4[iVar13];
                  if (bVar9 == 6) {
                    if (puVar6[iVar13] != 3) goto LAB_00364a54;
                    break;
                  }
                  if (bVar9 == 0) goto LAB_0036609d;
                  uVar14 = 1;
                  if (bVar9 < 4) {
                    uVar14 = puVar6[iVar13];
                  }
                }
                fwrite("  input ",8,1,pFVar7);
                Ndr_ObjWriteRange(p_00,iVar8,(FILE *)pFVar7,1);
                puVar6 = p_00->pBody;
                lVar21 = -1;
                if (iVar20 < (int)(puVar6[iVar8] + iVar8)) {
                  do {
                    bVar9 = p_00->pHead[iVar20];
                    if (bVar9 == 5) {
                      lVar21 = (long)(int)puVar6[iVar20];
                      break;
                    }
                    if (bVar9 == 0) goto LAB_0036609d;
                    uVar10 = 1;
                    if (bVar9 < 4) {
                      uVar10 = puVar6[iVar20];
                    }
                    iVar20 = iVar20 + uVar10;
                  } while (iVar20 < (int)(puVar6[iVar8] + iVar8));
                }
                fprintf(pFVar7," %s;\n",*(undefined8 *)((long)__ptr + lVar21 * 8));
                puVar4 = p_00->pHead;
                bVar9 = puVar4[iVar8];
              }
              else if (bVar9 == 0) goto LAB_0036609d;
              if (bVar9 == 0) goto LAB_0036609d;
              puVar6 = p_00->pBody;
              uVar10 = 1;
              if (bVar9 < 4) {
                uVar10 = puVar6[iVar8];
              }
LAB_00364a54:
              iVar8 = iVar8 + uVar10;
              iVar13 = puVar6[iVar11] + iVar11;
            } while (iVar8 < iVar13);
          }
          uVar10 = 0;
          if (Obj < iVar13) {
            puVar4 = p_00->pHead;
            uVar10 = 0;
            iVar13 = Obj;
            do {
              bVar9 = puVar4[iVar13];
              if (bVar9 == 3) {
                uVar14 = puVar6[iVar13];
                iVar20 = iVar13 + 1;
                for (iVar8 = iVar20; iVar8 < (int)(uVar14 + iVar13); iVar8 = iVar8 + uVar19) {
                  bVar9 = puVar4[iVar8];
                  if (bVar9 == 6) {
                    if (puVar6[iVar8] != 4) goto LAB_00364c01;
                    break;
                  }
                  if (bVar9 == 0) goto LAB_0036609d;
                  uVar19 = 1;
                  if (bVar9 < 4) {
                    uVar19 = puVar6[iVar8];
                  }
                }
                fwrite("  output ",9,1,pFVar7);
                Ndr_ObjWriteRange(p_00,iVar13,(FILE *)pFVar7,1);
                puVar6 = p_00->pBody;
                lVar21 = -1;
                if (iVar20 < (int)(puVar6[iVar13] + iVar13)) {
                  iVar8 = iVar20;
                  do {
                    bVar9 = p_00->pHead[iVar8];
                    if (bVar9 == 4) {
                      lVar21 = (long)(int)puVar6[iVar8];
                      break;
                    }
                    if (bVar9 == 0) goto LAB_0036609d;
                    uVar14 = 1;
                    if (bVar9 < 4) {
                      uVar14 = puVar6[iVar8];
                    }
                    iVar8 = iVar8 + uVar14;
                  } while (iVar8 < (int)(puVar6[iVar13] + iVar13));
                }
                fprintf(pFVar7," %s;\n",*(undefined8 *)((long)__ptr + lVar21 * 8));
                puVar4 = p_00->pHead;
                puVar6 = p_00->pBody;
                uVar14 = 0xffffffff;
                for (; iVar20 < (int)(puVar6[iVar13] + iVar13); iVar20 = iVar20 + uVar19) {
                  bVar9 = puVar4[iVar20];
                  if (bVar9 == 4) {
                    uVar14 = puVar6[iVar20];
                    break;
                  }
                  if (bVar9 == 0) goto LAB_0036609d;
                  uVar19 = 1;
                  if (bVar9 < 4) {
                    uVar19 = puVar6[iVar20];
                  }
                }
                lVar21 = (long)(int)uVar10;
                uVar10 = uVar10 + 1;
                *(uint *)((long)local_50 + lVar21 * 4) = uVar14;
                bVar9 = puVar4[iVar13];
              }
              else if (bVar9 == 0) goto LAB_0036609d;
              if (bVar9 == 0) goto LAB_0036609d;
              uVar14 = 1;
              if (bVar9 < 4) {
                uVar14 = puVar6[iVar13];
              }
LAB_00364c01:
              iVar13 = iVar13 + uVar14;
            } while (iVar13 < (int)(puVar6[iVar11] + iVar11));
          }
          fputc(10,pFVar7);
          puVar6 = p_00->pBody;
          if (Obj < (int)(puVar6[iVar11] + iVar11)) {
            puVar4 = p_00->pHead;
            iVar13 = Obj;
LAB_00364c42:
            bVar9 = puVar4[iVar13];
            if (bVar9 == 3) {
              uVar14 = puVar6[iVar13];
              iVar20 = uVar14 + iVar13;
              iVar15 = iVar13 + 1;
              for (iVar8 = iVar15; iVar8 < iVar20; iVar8 = iVar8 + uVar19) {
                bVar9 = puVar4[iVar8];
                if (bVar9 == 6) {
                  iVar16 = iVar15;
                  if (puVar6[iVar8] != 3) goto LAB_00364cc9;
                  break;
                }
                if (bVar9 == 0) goto LAB_0036609d;
                uVar19 = 1;
                if (bVar9 < 4) {
                  uVar19 = puVar6[iVar8];
                }
              }
              goto LAB_00364d00;
            }
            if (bVar9 != 0) goto LAB_00364c57;
            goto LAB_0036609d;
          }
LAB_00364e1b:
          free(local_50);
          fputc(10,pFVar7);
          puVar6 = p_00->pBody;
          if (Obj < (int)(puVar6[iVar11] + iVar11)) {
            puVar4 = p_00->pHead;
LAB_00364e4c:
            if (puVar4[Obj] != '\x03') {
              if (puVar4[Obj] != '\0') goto LAB_00365f28;
              goto LAB_0036609d;
            }
            iVar8 = puVar6[Obj] + Obj;
            iVar20 = Obj + 1;
            for (iVar13 = iVar20; iVar13 < iVar8; iVar13 = iVar13 + uVar10) {
              bVar9 = puVar4[iVar13];
              if (bVar9 == 6) {
                iVar15 = iVar20;
                if (puVar6[iVar13] != 3) goto LAB_00364ec5;
                break;
              }
              if (bVar9 == 0) goto LAB_0036609d;
              uVar10 = 1;
              if (bVar9 < 4) {
                uVar10 = puVar6[iVar13];
              }
            }
            goto LAB_00365f28;
          }
LAB_00365f8d:
          fwrite("\nendmodule\n\n",0xc,1,pFVar7);
          puVar4 = p_00->pHead;
          bVar9 = puVar4[iVar11];
        }
        else if (bVar9 == 0) goto LAB_0036609d;
        if (bVar9 == 0) {
LAB_0036609d:
          __assert_fail("p->pHead[i]",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/miniaig/ndr.h"
                        ,0x7e,"int Ndr_DataType(Ndr_Data_t *, int)");
        }
        puVar6 = p_00->pBody;
        uVar10 = 1;
        if (bVar9 < 4) {
          uVar10 = puVar6[iVar11];
        }
        iVar11 = iVar11 + uVar10;
      } while (iVar11 < (int)*puVar6);
    }
  }
  pFVar7 = fopen("test.ndr","wb");
  if (pFVar7 == (FILE *)0x0) {
    printf("Cannot open file \"%s\" for writing.\n","test.ndr");
    if (p_00 == (Ndr_Data_t *)0x0) goto LAB_00366073;
  }
  else {
    fwrite(p_00->pBody,4,(ulong)*p_00->pBody,pFVar7);
    fwrite(p_00->pHead,1,(ulong)*p_00->pBody,pFVar7);
    fclose(pFVar7);
  }
  free(p_00->pHead);
  free(p_00->pBody);
  free(p_00);
LAB_00366073:
  if (__ptr != (void *)0x0) {
    free(__ptr);
    return;
  }
  return;
  while( true ) {
    if (bVar9 == 0) goto LAB_0036609d;
    uVar19 = 1;
    if (bVar9 < 4) {
      uVar19 = puVar6[iVar16];
    }
    iVar16 = iVar16 + uVar19;
    if (iVar20 <= iVar16) break;
LAB_00364cc9:
    bVar9 = puVar4[iVar16];
    if (bVar9 == 6) {
      if (puVar6[iVar16] != 4) {
        if ((int)uVar10 < 1) goto LAB_00364d78;
        uVar22 = 0;
        goto LAB_00364d1d;
      }
      break;
    }
  }
  goto LAB_00364d00;
  while (uVar22 = uVar22 + 1, uVar22 != uVar10) {
LAB_00364d1d:
    iVar8 = iVar15;
    do {
      bVar9 = puVar4[iVar8];
      if (bVar9 == 5) {
        uVar19 = puVar6[iVar8];
        goto LAB_00364d69;
      }
      if (bVar9 == 0) goto LAB_0036609d;
      uVar19 = 1;
      if (bVar9 < 4) {
        uVar19 = puVar6[iVar8];
      }
      iVar8 = iVar8 + uVar19;
    } while (iVar8 < iVar20);
    uVar19 = 0xffffffff;
LAB_00364d69:
    if (*(uint *)((long)local_50 + uVar22 * 4) == uVar19) goto LAB_00364d00;
  }
LAB_00364d78:
  fwrite("  wire ",7,1,pFVar7);
  Ndr_ObjWriteRange(p_00,iVar13,(FILE *)pFVar7,1);
  puVar6 = p_00->pBody;
  lVar21 = -1;
  if (iVar15 < (int)(puVar6[iVar13] + iVar13)) {
    do {
      bVar9 = p_00->pHead[iVar15];
      if (bVar9 == 5) {
        lVar21 = (long)(int)puVar6[iVar15];
        break;
      }
      if (bVar9 == 0) goto LAB_0036609d;
      uVar14 = 1;
      if (bVar9 < 4) {
        uVar14 = puVar6[iVar15];
      }
      iVar15 = iVar15 + uVar14;
    } while (iVar15 < (int)(puVar6[iVar13] + iVar13));
  }
  fprintf(pFVar7," %s;\n",*(undefined8 *)((long)__ptr + lVar21 * 8));
  puVar4 = p_00->pHead;
  bVar9 = puVar4[iVar13];
LAB_00364c57:
  if (bVar9 == 0) goto LAB_0036609d;
  puVar6 = p_00->pBody;
  uVar14 = 1;
  if (bVar9 < 4) {
    uVar14 = puVar6[iVar13];
  }
LAB_00364d00:
  iVar13 = iVar13 + uVar14;
  if ((int)(puVar6[iVar11] + iVar11) <= iVar13) goto LAB_00364e1b;
  goto LAB_00364c42;
  while( true ) {
    if (bVar9 == 0) goto LAB_0036609d;
    uVar10 = 1;
    if (bVar9 < 4) {
      uVar10 = puVar6[iVar15];
    }
    iVar15 = iVar15 + uVar10;
    if (iVar8 <= iVar15) break;
LAB_00364ec5:
    bVar9 = puVar4[iVar15];
    if (bVar9 == 6) {
      iVar13 = iVar20;
      if (puVar6[iVar15] != 4) goto LAB_00364f05;
      break;
    }
  }
  goto LAB_00365f28;
  while( true ) {
    if (bVar9 == 0) goto LAB_0036609d;
    uVar10 = 1;
    if (bVar9 < 4) {
      uVar10 = puVar6[iVar13];
    }
    iVar13 = iVar13 + uVar10;
    if (iVar8 <= iVar13) break;
LAB_00364f05:
    bVar9 = puVar4[iVar13];
    if (bVar9 == 6) {
      uVar10 = puVar6[iVar13];
      if (0xff < (int)uVar10) {
        iVar13 = uVar10 - 0xff;
        lVar21 = -1;
        goto LAB_00364fa5;
      }
      switch(uVar10) {
      case 0x50:
        fprintf(pFVar7,"  %s ","ABC_READ");
        puVar6 = p_00->pBody;
        iVar13 = puVar6[Obj] + Obj;
        if (iVar13 <= iVar20) goto LAB_00365a8f;
        iVar8 = iVar20;
        goto LAB_00365165;
      case 0x51:
        fprintf(pFVar7,"  %s ","ABC_WRITE");
        puVar6 = p_00->pBody;
        iVar13 = puVar6[Obj] + Obj;
        if (iVar13 <= iVar20) goto LAB_00365bc8;
        iVar8 = iVar20;
        goto LAB_003652f9;
      default:
        goto switchD_00365130_caseD_52;
      case 0x58:
        fprintf(pFVar7,"  %s ","ABC_DFF");
        puVar6 = p_00->pBody;
        iVar13 = puVar6[Obj] + Obj;
        if (iVar13 <= iVar20) goto LAB_00365956;
        iVar8 = iVar20;
        goto LAB_0036528f;
      case 0x59:
        fprintf(pFVar7,"  %s ","ABC_DFFRSE");
        puVar6 = p_00->pBody;
        iVar13 = puVar6[Obj] + Obj;
        if (iVar13 <= iVar20) goto LAB_00365d36;
        iVar8 = iVar20;
      }
      goto LAB_00365363;
    }
  }
  uVar10 = 0xffffffff;
switchD_00365130_caseD_52:
  iVar13 = iVar20;
  do {
    bVar9 = puVar4[iVar13];
    if (bVar9 == 5) {
      lVar21 = (long)(int)puVar6[iVar13];
      goto LAB_00364fe2;
    }
    if (bVar9 == 0) goto LAB_0036609d;
    uVar14 = 1;
    if (bVar9 < 4) {
      uVar14 = puVar6[iVar13];
    }
    iVar13 = iVar13 + uVar14;
  } while (iVar13 < iVar8);
  lVar21 = -1;
LAB_00364fe2:
  fprintf(pFVar7,"  assign %s = ",*(undefined8 *)((long)__ptr + lVar21 * 8));
  puVar6 = p_00->pBody;
  iVar13 = puVar6[Obj] + Obj;
  if (iVar13 <= iVar20) {
LAB_003650fd:
    puVar6 = (uint *)0x0;
LAB_003650ff:
    pcVar3 = "%s;\n";
LAB_00365109:
    fprintf(pFVar7,pcVar3,puVar6);
    goto LAB_00365f28;
  }
  puVar4 = p_00->pHead;
  puVar17 = (uint *)0x0;
  puVar5 = (uint *)0x0;
  local_68 = 0;
  iVar8 = iVar20;
  do {
    bVar9 = puVar4[iVar8];
    if (bVar9 == 4) {
      local_68 = (ulong)((int)local_68 + 1);
      uVar14 = 1;
      puVar5 = puVar17;
      if (puVar17 == (uint *)0x0) {
        puVar5 = puVar6 + iVar8;
        puVar17 = puVar5;
      }
    }
    else {
      if (bVar9 == 0) goto LAB_0036609d;
      if (puVar5 != (uint *)0x0) break;
      if (bVar9 < 4) {
        uVar14 = puVar6[iVar8];
      }
      else {
        uVar14 = 1;
      }
      puVar5 = (uint *)0x0;
    }
    iVar8 = iVar8 + uVar14;
  } while (iVar8 < iVar13);
  iVar8 = (int)local_68;
  if (iVar8 == 0) {
    do {
      bVar9 = puVar4[iVar20];
      if (bVar9 == 9) {
        puVar6 = puVar6 + iVar20;
        goto LAB_003650ff;
      }
      if (bVar9 == 0) goto LAB_0036609d;
      uVar10 = 1;
      if (bVar9 < 4) {
        uVar10 = puVar6[iVar20];
      }
      iVar20 = iVar20 + uVar10;
    } while (iVar20 < iVar13);
    goto LAB_003650fd;
  }
  iVar15 = iVar20;
  if (iVar8 == 1) {
    do {
      bVar9 = puVar4[iVar15];
      if (bVar9 == 6) {
        if (puVar6[iVar15] == 0xb) {
          puVar6 = *(uint **)((long)__ptr + (long)(int)*puVar17 * 8);
          goto LAB_003650ff;
        }
        break;
      }
      if (bVar9 == 0) goto LAB_0036609d;
      uVar14 = 1;
      if (bVar9 < 4) {
        uVar14 = puVar6[iVar15];
      }
      iVar15 = iVar15 + uVar14;
    } while (iVar15 < iVar13);
  }
  if (uVar10 != 0x5c) {
    if (uVar10 == 0x5b) {
      fputs(*(char **)((long)__ptr + (long)(int)*puVar17 * 8),pFVar7);
      puVar6 = p_00->pBody;
      if (iVar20 < (int)(puVar6[Obj] + Obj)) {
        puVar5 = (uint *)0x0;
        puVar17 = (uint *)0x0;
        iVar13 = 0;
        do {
          bVar9 = p_00->pHead[iVar20];
          if (bVar9 == 8) {
            iVar13 = iVar13 + 1;
            uVar10 = 1;
            puVar17 = puVar5;
            if (puVar5 == (uint *)0x0) {
              puVar5 = puVar6 + iVar20;
              puVar17 = puVar5;
            }
          }
          else {
            if (bVar9 == 0) goto LAB_0036609d;
            if (puVar17 != (uint *)0x0) break;
            if (bVar9 < 4) {
              uVar10 = puVar6[iVar20];
            }
            else {
              uVar10 = 1;
            }
            puVar17 = (uint *)0x0;
          }
          iVar20 = iVar20 + uVar10;
        } while (iVar20 < (int)(puVar6[Obj] + Obj));
        if (iVar13 == 0) goto LAB_00365559;
        if (iVar13 == 1) {
          uVar10 = *puVar5;
          goto LAB_00365565;
        }
        fprintf(pFVar7,"[%d:%d]",(ulong)*puVar5,(ulong)puVar5[1]);
      }
      else {
LAB_00365559:
        uVar10 = 0;
LAB_00365565:
        fprintf(pFVar7,"[%d]",(ulong)uVar10);
      }
      __size = 2;
      pcVar3 = ";\n";
      goto LAB_00365f23;
    }
    if (iVar8 == 1) {
      do {
        bVar9 = puVar4[iVar20];
        if (bVar9 == 6) {
          uVar10 = puVar6[iVar20];
          goto LAB_00365854;
        }
        if (bVar9 == 0) goto LAB_0036609d;
        uVar10 = 1;
        if (bVar9 < 4) {
          uVar10 = puVar6[iVar20];
        }
        iVar20 = iVar20 + uVar10;
      } while (iVar20 < iVar13);
      uVar10 = 0xffffffff;
LAB_00365854:
      pcVar3 = Abc_OperName(uVar10);
      fprintf(pFVar7,"%s %s;\n",pcVar3,*(undefined8 *)((long)__ptr + (long)(int)*puVar17 * 8));
      goto LAB_00365f28;
    }
    if (iVar8 == 2) {
      uVar12 = *(undefined8 *)((long)__ptr + (long)(int)*puVar17 * 8);
      do {
        bVar9 = puVar4[iVar20];
        if (bVar9 == 6) {
          uVar10 = puVar6[iVar20];
          goto LAB_003658d5;
        }
        if (bVar9 == 0) goto LAB_0036609d;
        uVar10 = 1;
        if (bVar9 < 4) {
          uVar10 = puVar6[iVar20];
        }
        iVar20 = iVar20 + uVar10;
      } while (iVar20 < iVar13);
      uVar10 = 0xffffffff;
LAB_003658d5:
      pcVar3 = Abc_OperName(uVar10);
      uVar18 = *(undefined8 *)((long)__ptr + (long)(int)puVar17[1] * 8);
      __format = "%s %s %s;\n";
LAB_0036592c:
      fprintf(pFVar7,__format,uVar12,pcVar3,uVar18);
      goto LAB_00365f28;
    }
    if (uVar10 == 0x32 && iVar8 == 3) {
      uVar12 = *(undefined8 *)((long)__ptr + (long)(int)*puVar17 * 8);
      pcVar3 = *(char **)((long)__ptr + (long)(int)puVar17[1] * 8);
      uVar18 = *(undefined8 *)((long)__ptr + (long)(int)puVar17[2] * 8);
      __format = "%s + %s + %s;\n";
      goto LAB_0036592c;
    }
    if (uVar10 == 0x15) {
      uVar12 = *(undefined8 *)((long)__ptr + (long)(int)*puVar17 * 8);
      pcVar3 = *(char **)((long)__ptr + (long)(int)puVar17[1] * 8);
      uVar18 = *(undefined8 *)((long)__ptr + (long)(int)puVar17[2] * 8);
      __format = "%s ? %s : %s;\n";
      goto LAB_0036592c;
    }
    iVar13 = Ndr_ObjReadBody(p_00,Obj,6);
    puVar6 = (uint *)Abc_OperName(iVar13);
    pcVar3 = "<cannot write operation %s>;\n";
    goto LAB_00365109;
  }
  fputc(0x7b,pFVar7);
  if (0 < iVar8) {
    uVar22 = 0;
    do {
      pcVar3 = "    \"%s\", ";
      if (iVar8 - 1 == uVar22) {
        pcVar3 = "T = %d\t\t";
      }
      fprintf(pFVar7,"%s%s",*(undefined8 *)((long)__ptr + (long)(int)puVar17[uVar22] * 8),pcVar3 + 8
             );
      uVar22 = uVar22 + 1;
    } while (local_68 != uVar22);
  }
  __size = 3;
  pcVar3 = "};\n";
  goto LAB_00365f23;
LAB_00364fa5:
  if ((int)((uVar10 - 0x100) + puVar6[uVar10 - 0x100]) <= iVar13) goto LAB_003651a0;
  bVar9 = puVar4[iVar13];
  if (bVar9 == 7) {
    lVar21 = (long)(int)puVar6[iVar13];
    goto LAB_003651a0;
  }
  if (bVar9 == 0) goto LAB_0036609d;
  uVar14 = 1;
  if (bVar9 < 4) {
    uVar14 = puVar6[iVar13];
  }
  iVar13 = iVar13 + uVar14;
  goto LAB_00364fa5;
LAB_003651a0:
  fprintf(pFVar7,"  %s ",*(undefined8 *)((long)__ptr + lVar21 * 8));
  puVar6 = p_00->pBody;
  iVar13 = puVar6[Obj] + Obj;
  if (iVar20 < iVar13) {
    iVar8 = iVar20;
    do {
      bVar9 = p_00->pHead[iVar8];
      if (bVar9 == 7) {
        iVar15 = iVar20;
        if (0 < (int)puVar6[iVar8]) goto LAB_00365215;
        break;
      }
      if (bVar9 == 0) goto LAB_0036609d;
      uVar10 = 1;
      if (bVar9 < 4) {
        uVar10 = puVar6[iVar8];
      }
      iVar8 = iVar8 + uVar10;
    } while (iVar8 < iVar13);
  }
  goto LAB_003655f7;
  while( true ) {
    if (bVar9 == 0) goto LAB_0036609d;
    uVar10 = 1;
    if (bVar9 < 4) {
      uVar10 = puVar6[iVar15];
    }
    iVar15 = iVar15 + uVar10;
    if (iVar13 <= iVar15) break;
LAB_00365215:
    bVar9 = p_00->pHead[iVar15];
    if (bVar9 == 7) {
      lVar21 = (long)(int)puVar6[iVar15];
      goto LAB_003655dd;
    }
  }
  lVar21 = -1;
LAB_003655dd:
  fprintf(pFVar7,"%s ",*(undefined8 *)((long)__ptr + lVar21 * 8));
LAB_003655f7:
  fwrite("( ",2,1,pFVar7);
  puVar6 = p_00->pBody;
  if (iVar20 < (int)(puVar6[Obj] + Obj)) {
    puVar17 = (uint *)0x0;
    puVar5 = (uint *)0x0;
    uVar10 = 0;
    do {
      bVar9 = p_00->pHead[iVar20];
      if (bVar9 == 4) {
        uVar10 = uVar10 + 1;
        uVar14 = 1;
        puVar5 = puVar17;
        if (puVar17 == (uint *)0x0) {
          puVar5 = puVar6 + iVar20;
          puVar17 = puVar5;
        }
      }
      else {
        if (bVar9 == 0) goto LAB_0036609d;
        if (puVar5 != (uint *)0x0) break;
        if (bVar9 < 4) {
          uVar14 = puVar6[iVar20];
        }
        else {
          uVar14 = 1;
        }
        puVar5 = (uint *)0x0;
      }
      iVar20 = iVar20 + uVar14;
    } while (iVar20 < (int)(puVar6[Obj] + Obj));
    if (0 < (int)uVar10) {
      uVar22 = 0;
      do {
        pcVar3 = ",";
        if (uVar10 - 1 == uVar22) {
          pcVar3 = "";
        }
        fprintf(pFVar7,"%s%s ",*(undefined8 *)((long)__ptr + (long)(int)puVar17[uVar22] * 8),pcVar3)
        ;
        uVar22 = uVar22 + 1;
      } while (uVar10 != uVar22);
    }
  }
  fwrite(");\n",3,1,pFVar7);
  goto LAB_00365f28;
  while( true ) {
    if (bVar9 == 0) goto LAB_0036609d;
    uVar10 = 1;
    if (bVar9 < 4) {
      uVar10 = puVar6[iVar8];
    }
    iVar8 = iVar8 + uVar10;
    if (iVar13 <= iVar8) break;
LAB_00365363:
    bVar9 = p_00->pHead[iVar8];
    if (bVar9 == 7) {
      iVar15 = iVar20;
      if (0 < (int)puVar6[iVar8]) goto LAB_00365810;
      break;
    }
  }
  goto LAB_00365d36;
  while( true ) {
    if (bVar9 == 0) goto LAB_0036609d;
    uVar10 = 1;
    if (bVar9 < 4) {
      uVar10 = puVar6[iVar15];
    }
    iVar15 = iVar15 + uVar10;
    if (iVar13 <= iVar15) break;
LAB_00365810:
    bVar9 = p_00->pHead[iVar15];
    if (bVar9 == 7) {
      lVar21 = (long)(int)puVar6[iVar15];
      goto LAB_00365d1c;
    }
  }
  lVar21 = -1;
LAB_00365d1c:
  fprintf(pFVar7,"%s ",*(undefined8 *)((long)__ptr + lVar21 * 8));
LAB_00365d36:
  fwrite("( ",2,1,pFVar7);
  puVar6 = p_00->pBody;
  iVar13 = puVar6[Obj] + Obj;
  lVar21 = -1;
  if (iVar20 < iVar13) {
    puVar5 = (uint *)0x0;
    puVar17 = (uint *)0x0;
    iVar8 = iVar20;
    do {
      bVar9 = p_00->pHead[iVar8];
      if (bVar9 == 4) {
        uVar10 = 1;
        puVar17 = puVar5;
        if (puVar5 == (uint *)0x0) {
          puVar17 = puVar6 + iVar8;
          puVar5 = puVar17;
        }
      }
      else {
        if (bVar9 == 0) goto LAB_0036609d;
        if (puVar17 != (uint *)0x0) break;
        if (bVar9 < 4) {
          uVar10 = puVar6[iVar8];
        }
        else {
          uVar10 = 1;
        }
        puVar17 = (uint *)0x0;
      }
      iVar8 = iVar8 + uVar10;
    } while (iVar8 < iVar13);
    do {
      bVar9 = p_00->pHead[iVar20];
      if (bVar9 == 5) {
        lVar21 = (long)(int)puVar6[iVar20];
        break;
      }
      if (bVar9 == 0) goto LAB_0036609d;
      uVar10 = 1;
      if (bVar9 < 4) {
        uVar10 = puVar6[iVar20];
      }
      iVar20 = iVar20 + uVar10;
    } while (iVar20 < iVar13);
  }
  else {
    puVar5 = (uint *)0x0;
  }
  fprintf(pFVar7,".q(%s), ",*(undefined8 *)((long)__ptr + lVar21 * 8));
  fprintf(pFVar7,".d(%s), ",*(undefined8 *)((long)__ptr + (long)(int)*puVar5 * 8));
  fprintf(pFVar7,".clk(%s), ",*(undefined8 *)((long)__ptr + (long)(int)puVar5[1] * 8));
  fprintf(pFVar7,".reset(%s), ",*(undefined8 *)((long)__ptr + (long)(int)puVar5[2] * 8));
  fprintf(pFVar7,".set(%s), ",*(undefined8 *)((long)__ptr + (long)(int)puVar5[3] * 8));
  fprintf(pFVar7,".enable(%s), ",*(undefined8 *)((long)__ptr + (long)(int)puVar5[4] * 8));
  fprintf(pFVar7,".async(%s), ",*(undefined8 *)((long)__ptr + (long)(int)puVar5[5] * 8));
  fprintf(pFVar7,".sre(%s), ",*(undefined8 *)((long)__ptr + (long)(int)puVar5[6] * 8));
  fprintf(pFVar7,".init(%s) ",*(undefined8 *)((long)__ptr + (long)(int)puVar5[7] * 8));
  __size = 3;
  pcVar3 = ");\n";
  goto LAB_00365f23;
  while( true ) {
    if (bVar9 == 0) goto LAB_0036609d;
    uVar10 = 1;
    if (bVar9 < 4) {
      uVar10 = puVar6[iVar8];
    }
    iVar8 = iVar8 + uVar10;
    if (iVar13 <= iVar8) break;
LAB_0036528f:
    bVar9 = p_00->pHead[iVar8];
    if (bVar9 == 7) {
      iVar15 = iVar20;
      if (0 < (int)puVar6[iVar8]) goto LAB_0036572f;
      break;
    }
  }
  goto LAB_00365956;
  while( true ) {
    if (bVar9 == 0) goto LAB_0036609d;
    uVar10 = 1;
    if (bVar9 < 4) {
      uVar10 = puVar6[iVar15];
    }
    iVar15 = iVar15 + uVar10;
    if (iVar13 <= iVar15) break;
LAB_0036572f:
    bVar9 = p_00->pHead[iVar15];
    if (bVar9 == 7) {
      lVar21 = (long)(int)puVar6[iVar15];
      goto LAB_0036593c;
    }
  }
  lVar21 = -1;
LAB_0036593c:
  fprintf(pFVar7,"%s ",*(undefined8 *)((long)__ptr + lVar21 * 8));
LAB_00365956:
  fwrite("( ",2,1,pFVar7);
  puVar6 = p_00->pBody;
  iVar13 = puVar6[Obj] + Obj;
  lVar21 = -1;
  if (iVar20 < iVar13) {
    puVar5 = (uint *)0x0;
    puVar17 = (uint *)0x0;
    iVar8 = iVar20;
    do {
      bVar9 = p_00->pHead[iVar8];
      if (bVar9 == 4) {
        uVar10 = 1;
        puVar17 = puVar5;
        if (puVar5 == (uint *)0x0) {
          puVar17 = puVar6 + iVar8;
          puVar5 = puVar17;
        }
      }
      else {
        if (bVar9 == 0) goto LAB_0036609d;
        if (puVar17 != (uint *)0x0) break;
        if (bVar9 < 4) {
          uVar10 = puVar6[iVar8];
        }
        else {
          uVar10 = 1;
        }
        puVar17 = (uint *)0x0;
      }
      iVar8 = iVar8 + uVar10;
    } while (iVar8 < iVar13);
    do {
      bVar9 = p_00->pHead[iVar20];
      if (bVar9 == 5) {
        lVar21 = (long)(int)puVar6[iVar20];
        break;
      }
      if (bVar9 == 0) goto LAB_0036609d;
      uVar10 = 1;
      if (bVar9 < 4) {
        uVar10 = puVar6[iVar20];
      }
      iVar20 = iVar20 + uVar10;
    } while (iVar20 < iVar13);
  }
  else {
    puVar5 = (uint *)0x0;
  }
  fprintf(pFVar7,".q(%s), ",*(undefined8 *)((long)__ptr + lVar21 * 8));
  fprintf(pFVar7,".d(%s), ",*(undefined8 *)((long)__ptr + (long)(int)*puVar5 * 8));
  uVar12 = *(undefined8 *)((long)__ptr + (long)(int)puVar5[1] * 8);
  pcVar3 = ".init(%s) ";
  goto LAB_00365cf8;
  while( true ) {
    if (bVar9 == 0) goto LAB_0036609d;
    uVar10 = 1;
    if (bVar9 < 4) {
      uVar10 = puVar6[iVar8];
    }
    iVar8 = iVar8 + uVar10;
    if (iVar13 <= iVar8) break;
LAB_003652f9:
    bVar9 = p_00->pHead[iVar8];
    if (bVar9 == 7) {
      iVar15 = iVar20;
      if (0 < (int)puVar6[iVar8]) goto LAB_003657c5;
      break;
    }
  }
  goto LAB_00365bc8;
  while( true ) {
    if (bVar9 == 0) goto LAB_0036609d;
    uVar10 = 1;
    if (bVar9 < 4) {
      uVar10 = puVar6[iVar15];
    }
    iVar15 = iVar15 + uVar10;
    if (iVar13 <= iVar15) break;
LAB_003657c5:
    bVar9 = p_00->pHead[iVar15];
    if (bVar9 == 7) {
      lVar21 = (long)(int)puVar6[iVar15];
      goto LAB_00365bae;
    }
  }
  lVar21 = -1;
LAB_00365bae:
  fprintf(pFVar7,"%s ",*(undefined8 *)((long)__ptr + lVar21 * 8));
LAB_00365bc8:
  fwrite("( ",2,1,pFVar7);
  puVar6 = p_00->pBody;
  iVar13 = puVar6[Obj] + Obj;
  lVar21 = -1;
  if (iVar20 < iVar13) {
    puVar5 = (uint *)0x0;
    puVar17 = (uint *)0x0;
    iVar8 = iVar20;
    do {
      bVar9 = p_00->pHead[iVar8];
      if (bVar9 == 4) {
        uVar10 = 1;
        puVar17 = puVar5;
        if (puVar5 == (uint *)0x0) {
          puVar17 = puVar6 + iVar8;
          puVar5 = puVar17;
        }
      }
      else {
        if (bVar9 == 0) goto LAB_0036609d;
        if (puVar17 != (uint *)0x0) break;
        if (bVar9 < 4) {
          uVar10 = puVar6[iVar8];
        }
        else {
          uVar10 = 1;
        }
        puVar17 = (uint *)0x0;
      }
      iVar8 = iVar8 + uVar10;
    } while (iVar8 < iVar13);
    do {
      bVar9 = p_00->pHead[iVar20];
      if (bVar9 == 5) {
        lVar21 = (long)(int)puVar6[iVar20];
        break;
      }
      if (bVar9 == 0) goto LAB_0036609d;
      uVar10 = 1;
      if (bVar9 < 4) {
        uVar10 = puVar6[iVar20];
      }
      iVar20 = iVar20 + uVar10;
    } while (iVar20 < iVar13);
  }
  else {
    puVar5 = (uint *)0x0;
  }
  fprintf(pFVar7,".mem_out(%s), ",*(undefined8 *)((long)__ptr + lVar21 * 8));
  fprintf(pFVar7,".mem_in(%s), ",*(undefined8 *)((long)__ptr + (long)(int)*puVar5 * 8));
  fprintf(pFVar7,".addr(%s), ",*(undefined8 *)((long)__ptr + (long)(int)puVar5[1] * 8));
  uVar12 = *(undefined8 *)((long)__ptr + (long)(int)puVar5[2] * 8);
  pcVar3 = ".data(%s) ";
  goto LAB_00365cf8;
  while( true ) {
    if (bVar9 == 0) goto LAB_0036609d;
    uVar10 = 1;
    if (bVar9 < 4) {
      uVar10 = puVar6[iVar8];
    }
    iVar8 = iVar8 + uVar10;
    if (iVar13 <= iVar8) break;
LAB_00365165:
    bVar9 = p_00->pHead[iVar8];
    if (bVar9 == 7) {
      iVar15 = iVar20;
      if (0 < (int)puVar6[iVar8]) goto LAB_0036577a;
      break;
    }
  }
  goto LAB_00365a8f;
  while( true ) {
    if (bVar9 == 0) goto LAB_0036609d;
    uVar10 = 1;
    if (bVar9 < 4) {
      uVar10 = puVar6[iVar15];
    }
    iVar15 = iVar15 + uVar10;
    if (iVar13 <= iVar15) break;
LAB_0036577a:
    bVar9 = p_00->pHead[iVar15];
    if (bVar9 == 7) {
      lVar21 = (long)(int)puVar6[iVar15];
      goto LAB_00365a75;
    }
  }
  lVar21 = -1;
LAB_00365a75:
  fprintf(pFVar7,"%s ",*(undefined8 *)((long)__ptr + lVar21 * 8));
LAB_00365a8f:
  fwrite("( ",2,1,pFVar7);
  puVar6 = p_00->pBody;
  iVar13 = puVar6[Obj] + Obj;
  lVar21 = -1;
  if (iVar20 < iVar13) {
    puVar5 = (uint *)0x0;
    puVar17 = (uint *)0x0;
    iVar8 = iVar20;
    do {
      bVar9 = p_00->pHead[iVar8];
      if (bVar9 == 4) {
        uVar10 = 1;
        puVar17 = puVar5;
        if (puVar5 == (uint *)0x0) {
          puVar17 = puVar6 + iVar8;
          puVar5 = puVar17;
        }
      }
      else {
        if (bVar9 == 0) goto LAB_0036609d;
        if (puVar17 != (uint *)0x0) break;
        if (bVar9 < 4) {
          uVar10 = puVar6[iVar8];
        }
        else {
          uVar10 = 1;
        }
        puVar17 = (uint *)0x0;
      }
      iVar8 = iVar8 + uVar10;
    } while (iVar8 < iVar13);
    do {
      bVar9 = p_00->pHead[iVar20];
      if (bVar9 == 5) {
        lVar21 = (long)(int)puVar6[iVar20];
        break;
      }
      if (bVar9 == 0) goto LAB_0036609d;
      uVar10 = 1;
      if (bVar9 < 4) {
        uVar10 = puVar6[iVar20];
      }
      iVar20 = iVar20 + uVar10;
    } while (iVar20 < iVar13);
  }
  else {
    puVar5 = (uint *)0x0;
  }
  fprintf(pFVar7,".data(%s), ",*(undefined8 *)((long)__ptr + lVar21 * 8));
  fprintf(pFVar7,".mem_in(%s), ",*(undefined8 *)((long)__ptr + (long)(int)*puVar5 * 8));
  uVar12 = *(undefined8 *)((long)__ptr + (long)(int)puVar5[1] * 8);
  pcVar3 = ".addr(%s) ";
LAB_00365cf8:
  fprintf(pFVar7,pcVar3,uVar12);
  __size = 3;
  pcVar3 = ");\n";
LAB_00365f23:
  fwrite(pcVar3,__size,1,pFVar7);
LAB_00365f28:
  puVar4 = p_00->pHead;
  if (puVar4[Obj] == 0) goto LAB_0036609d;
  puVar6 = p_00->pBody;
  uVar10 = 1;
  if (puVar4[Obj] < 4) {
    uVar10 = puVar6[Obj];
  }
  Obj = Obj + uVar10;
  if ((int)(puVar6[iVar11] + iVar11) <= Obj) goto LAB_00365f8d;
  goto LAB_00364e4c;
}

Assistant:

void Wlc_NtkToNdrTest( Wlc_Ntk_t * pNtk )
{
    // transform
    void * pDesign = Wlc_NtkToNdr( pNtk );

    // collect names     
    Wlc_Obj_t * pObj;  int i;
    char ** ppNames = ABC_ALLOC( char *, Wlc_NtkObjNum(pNtk) + 1 );
    Wlc_NtkForEachObj( pNtk, pObj, i ) 
        ppNames[i] = Wlc_ObjName(pNtk, i);

    // verify by writing Verilog
    Ndr_WriteVerilog( NULL, pDesign, ppNames );
    Ndr_Write( "test.ndr", pDesign );

    // cleanup
    Ndr_Delete( pDesign );
    ABC_FREE( ppNames );
}